

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *window_00;
  code *pcVar1;
  ImGuiContext_conflict *pIVar2;
  bool bVar3;
  undefined1 uVar4;
  ImDrawList *this;
  uint local_38;
  ImGuiItemFlags item_flags;
  ImGuiWindow *window;
  ImGuiContext_conflict *g;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar2 = GImGui;
  if (((GImGui->HoveredId == 0) || (GImGui->HoveredId == id)) ||
     ((GImGui->HoveredIdAllowOverlap & 1U) != 0)) {
    window_00 = GImGui->CurrentWindow;
    if (GImGui->HoveredWindow == window_00) {
      if (((GImGui->ActiveId == 0) || (GImGui->ActiveId == id)) ||
         ((GImGui->ActiveIdAllowOverlap & 1U) != 0)) {
        bVar3 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
        if (bVar3) {
          if ((pIVar2->NavDisableMouseHover & 1U) == 0) {
            bVar3 = IsWindowContentHoverable(window_00,0);
            if (bVar3) {
              if (id != 0) {
                SetHoveredID(id);
              }
              if ((pIVar2->LastItemData).ID == id) {
                local_38 = (pIVar2->LastItemData).InFlags;
              }
              else {
                local_38 = pIVar2->CurrentItemFlags;
              }
              if ((local_38 & 4) == 0) {
                if (id != 0) {
                  if (((pIVar2->DebugItemPickerActive & 1U) != 0) &&
                     (pIVar2->HoveredIdPreviousFrame == id)) {
                    this = GetForegroundDrawList();
                    ImDrawList::AddRect(this,&bb->Min,&bb->Max,0xff00ffff,0.0,0,1.0);
                  }
                  if (pIVar2->DebugItemPickerBreakId == id) {
                    pcVar1 = (code *)swi(3);
                    uVar4 = (*pcVar1)();
                    return (bool)uVar4;
                  }
                }
                bb_local._7_1_ = true;
              }
              else {
                if (pIVar2->ActiveId == id) {
                  ClearActiveID();
                }
                pIVar2->HoveredIdDisabled = true;
                bb_local._7_1_ = false;
              }
            }
            else {
              pIVar2->HoveredIdDisabled = true;
              bb_local._7_1_ = false;
            }
          }
          else {
            bb_local._7_1_ = false;
          }
        }
        else {
          bb_local._7_1_ = false;
        }
      }
      else {
        bb_local._7_1_ = false;
      }
    }
    else {
      bb_local._7_1_ = false;
    }
  }
  else {
    bb_local._7_1_ = false;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;
    if (g.NavDisableMouseHover)
        return false;
    if (!IsWindowContentHoverable(window, ImGuiHoveredFlags_None))
    {
        g.HoveredIdDisabled = true;
        return false;
    }

    // We exceptionally allow this function to be called with id==0 to allow using it for easy high-level
    // hover test in widgets code. We could also decide to split this function is two.
    if (id != 0)
        SetHoveredID(id);

    // When disabled we'll return false but still set HoveredId
    ImGuiItemFlags item_flags = (g.LastItemData.ID == id ? g.LastItemData.InFlags : g.CurrentItemFlags);
    if (item_flags & ImGuiItemFlags_Disabled)
    {
        // Release active id if turning disabled
        if (g.ActiveId == id)
            ClearActiveID();
        g.HoveredIdDisabled = true;
        return false;
    }

    if (id != 0)
    {
        // [DEBUG] Item Picker tool!
        // We perform the check here because SetHoveredID() is not frequently called (1~ time a frame), making
        // the cost of this tool near-zero. We can get slightly better call-stack and support picking non-hovered
        // items if we perform the test in ItemAdd(), but that would incur a small runtime cost.
        // #define IMGUI_DEBUG_TOOL_ITEM_PICKER_EX in imconfig.h if you want this check to also be performed in ItemAdd().
        if (g.DebugItemPickerActive && g.HoveredIdPreviousFrame == id)
            GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
        if (g.DebugItemPickerBreakId == id)
            IM_DEBUG_BREAK();
    }

    return true;
}